

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void __thiscall
VectorFormatter<DefaultFormatter>::Ser<VectorWriter,std::vector<CInv,std::allocator<CInv>>>
          (VectorFormatter<DefaultFormatter> *this,VectorWriter *s,
          vector<CInv,_std::allocator<CInv>_> *v)

{
  long lVar1;
  pointer pCVar2;
  value_type *elem;
  pointer pCVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<VectorWriter>
            (s,((long)(v->super__Vector_base<CInv,_std::allocator<CInv>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(v->super__Vector_base<CInv,_std::allocator<CInv>_>)._M_impl.
                     super__Vector_impl_data._M_start) / 0x24);
  pCVar2 = (v->super__Vector_base<CInv,_std::allocator<CInv>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (pCVar3 = (v->super__Vector_base<CInv,_std::allocator<CInv>_>)._M_impl.super__Vector_impl_data
                ._M_start; pCVar3 != pCVar2; pCVar3 = pCVar3 + 1) {
    CInv::SerializationOps<VectorWriter,CInv_const,ActionSerialize>(pCVar3,s);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }